

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::InputFile::multiPartInitialize(InputFile *this,InputPartData *part)

{
  long in_RSI;
  long in_RDI;
  Header *in_stack_00000048;
  Header *in_stack_00000050;
  InputFile *in_stack_000003a0;
  
  *(undefined8 *)(*(long *)(in_RDI + 8) + 0xf8) = *(undefined8 *)(in_RSI + 0x48);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0x60) = *(undefined4 *)(in_RSI + 0x40);
  Header::operator=(in_stack_00000050,in_stack_00000048);
  *(undefined4 *)(*(long *)(in_RDI + 8) + 0xdc) = *(undefined4 *)(in_RSI + 0x3c);
  *(long *)(*(long *)(in_RDI + 8) + 0xe0) = in_RSI;
  initialize(in_stack_000003a0);
  return;
}

Assistant:

void
InputFile::multiPartInitialize (InputPartData* part)
{
    _data->_streamData = part->mutex;
    _data->version = part->version;
    _data->header = part->header;
    _data->partNumber = part->partNumber;
    _data->part = part;

    initialize();
}